

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O0

bool __thiscall
cppnet::EpollEventActions::MakeEpollEvent
          (EpollEventActions *this,Event *event,epoll_event **ep_event)

{
  _func_int **pp_Var1;
  bool bVar2;
  SingletonLogger *this_00;
  element_type *this_01;
  epoll_event *peVar3;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  shared_ptr<cppnet::RWSocket> rw_sock;
  undefined1 local_38 [8];
  shared_ptr<cppnet::Socket> sock;
  epoll_event **ep_event_local;
  Event *event_local;
  EpollEventActions *this_local;
  
  sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ep_event;
  Event::GetSocket((Event *)local_38);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (bVar2) {
    std::dynamic_pointer_cast<cppnet::RWSocket,cppnet::Socket>
              ((shared_ptr<cppnet::Socket> *)local_58);
    std::__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_58);
    RWSocket::GetAlloter((RWSocket *)local_68);
    this_01 = std::
              __shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_68);
    peVar3 = AlloterWrap::PoolNew<epoll_event>(this_01);
    (sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)peVar3;
    std::shared_ptr<cppnet::AlloterWrap>::~shared_ptr((shared_ptr<cppnet::AlloterWrap> *)local_68);
    pp_Var1 = (sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_vptr__Sp_counted_base;
    *(undefined4 *)(pp_Var1 + 1) = 0;
    *pp_Var1 = (_func_int *)0x0;
    Event::SetData(event,(sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base);
    *(Event **)
     ((long)(sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_vptr__Sp_counted_base + 4) = event;
    rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
         = 1;
    std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)local_58);
  }
  else {
    this_00 = Singleton<cppnet::SingletonLogger>::Instance();
    SingletonLogger::Warn
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
               ,0x187,"socket is already destroyed! event %s","AddSendEvent");
    rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
         = 1;
  }
  std::shared_ptr<cppnet::Socket>::~shared_ptr((shared_ptr<cppnet::Socket> *)local_38);
  return bVar2;
}

Assistant:

bool EpollEventActions::MakeEpollEvent(Event* event, epoll_event* &ep_event) {
    auto sock = event->GetSocket();
    if (!sock) {
        LOG_WARN("socket is already destroyed! event %s", "AddSendEvent");
        return false;
    }

    auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
    ep_event = rw_sock->GetAlloter()->PoolNew<epoll_event>();
    memset(ep_event, 0, sizeof(epoll_event));
    event->SetData(ep_event);
    ep_event->data.ptr = (void*)event;

    return true;
}